

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::_unscaleSolutionReal
          (SoPlexBase<double> *this,SPxLPBase<double> *LP,bool persistent)

{
  Verbosity VVar1;
  ostream *poVar2;
  char cVar3;
  byte bVar4;
  char *pcVar5;
  Verbosity old_verbosity;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," --- unscaling ",0xf);
    pcVar5 = "internal";
    if (persistent) {
      pcVar5 = "external";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],pcVar5,8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity]," solution",9);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar3 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  (*this->_scaler->_vptr_SPxScaler[0x22])(this->_scaler,LP,&this->_solReal);
  (*this->_scaler->_vptr_SPxScaler[0x23])(this->_scaler,LP,&(this->_solReal)._slacks);
  (*this->_scaler->_vptr_SPxScaler[0x24])(this->_scaler,LP,&(this->_solReal)._dual);
  (*this->_scaler->_vptr_SPxScaler[0x25])(this->_scaler,LP,&(this->_solReal)._redCost);
  bVar4 = (this->_solReal).field_0x98;
  if ((bVar4 & 2) != 0) {
    (*this->_scaler->_vptr_SPxScaler[0x26])(this->_scaler,LP,&(this->_solReal)._primalRay);
    bVar4 = (this->_solReal).field_0x98;
  }
  if ((bVar4 & 8) == 0) {
    return;
  }
  (*this->_scaler->_vptr_SPxScaler[0x27])(this->_scaler,LP,&(this->_solReal)._dualFarkas);
  return;
}

Assistant:

void SoPlexBase<R>::_unscaleSolutionReal(SPxLPBase<R>& LP, bool persistent)
{
   SPX_MSG_INFO1(spxout, spxout << " --- unscaling " << (persistent ? "external" : "internal") <<
                 " solution" << std::endl;)
   assert(_scaler);
   assert(!persistent || (boolParam(SoPlexBase<R>::PERSISTENTSCALING) && _isRealLPScaled));
   _scaler->unscalePrimal(LP, _solReal._primal);
   _scaler->unscaleSlacks(LP, _solReal._slacks);
   _scaler->unscaleDual(LP, _solReal._dual);
   _scaler->unscaleRedCost(LP, _solReal._redCost);

   if(_solReal.hasPrimalRay())
      _scaler->unscalePrimalray(LP, _solReal._primalRay);

   if(_solReal.hasDualFarkas())
      _scaler->unscaleDualray(LP, _solReal._dualFarkas);
}